

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismModel::_prove_no_clique(HomomorphismModel *this,uint g,int p,int tt)

{
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var1;
  undefined8 *puVar2;
  Proof *pPVar3;
  long lVar4;
  _func_int ***ppp_Var5;
  _Head_base<0UL,_gss::RestartsSchedule_*,_false> _Var6;
  _Rb_tree_node_base *p_Var7;
  ProofError *this_00;
  uint uVar8;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint t;
  ulong uVar13;
  ulong uVar14;
  int count;
  InputGraph gv_1;
  vector<int,_std::allocator<int>_> invinclude;
  vector<int,_std::allocator<int>_> include;
  InputGraph gv;
  CliqueResult result;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  p_clique;
  CliqueParams params;
  map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  t_clique_neighbourhood;
  int local_274;
  ulong local_270;
  ulong local_268;
  NamedVertex local_260;
  InputGraph local_238;
  vector<int,_std::allocator<int>_> local_230;
  NamedVertex local_218;
  ulong local_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  undefined1 local_1d0 [8];
  undefined1 local_1c8 [32];
  ulong local_1a8;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  bool local_170;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  undefined1 local_148 [40];
  _Head_base<0UL,_gss::RestartsSchedule_*,_false> local_120;
  undefined8 local_118;
  bool local_110;
  _Any_data local_108;
  _Manager_type p_Stack_f8;
  _Invoker_type p_Stack_f0;
  _Optional_payload_base<gss::ProofOptions> local_e8;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  bool local_88;
  bool local_80;
  undefined **local_78;
  ulong local_70;
  long local_68;
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  
  local_268 = CONCAT44(in_register_00000014,p);
  local_270 = CONCAT44(in_register_0000000c,tt);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_168.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_168.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._0_4_ = -1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_218,(ulong)this->pattern_size,
             (value_type_conflict1 *)local_148,(allocator_type *)local_1d0);
  local_148._0_8_ = (ulong)(uint)local_148._4_4_ << 0x20;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_230,(ulong)this->pattern_size,(value_type_conflict1 *)local_148,
             (allocator_type *)local_1d0);
  uVar8 = this->pattern_size;
  if ((int)uVar8 < 1) {
    iVar9 = 0;
  }
  else {
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    iVar9 = (int)local_268;
    iVar11 = iVar9 + 0x3f;
    if (-1 < iVar9) {
      iVar11 = iVar9;
    }
    uVar12 = 0;
    iVar9 = 0;
    do {
      if ((local_268 & 0xffffffff) != uVar12) {
        lVar10 = *(long *)&((_Var1._M_head_impl)->pattern_graph_rows).
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
        ;
        lVar4 = (ulong)(this->max_graphs * (int)uVar12 + g) * 0x88;
        if (*(uint *)(lVar10 + 0x80 + lVar4) < 0x11) {
          lVar10 = lVar10 + lVar4;
        }
        else {
          lVar10 = *(long *)(lVar10 + lVar4);
        }
        if ((*(ulong *)(lVar10 + (long)(iVar11 >> 6) * 8) & 1L << (local_268 & 0x3f)) != 0) {
          *(int *)(local_218._0_8_ + uVar12 * 4) = iVar9;
          local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar9] = (int)uVar12;
          iVar9 = iVar9 + 1;
          uVar8 = this->pattern_size;
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(int)uVar8);
  }
  InputGraph::InputGraph((InputGraph *)&local_1e8,iVar9,false,false);
  uVar8 = this->pattern_size;
  if (uVar8 != 0) {
    uVar12 = 0;
    do {
      if ((*(int *)(local_218._0_8_ + uVar12 * 4) != -1) && (uVar8 != 0)) {
        uVar13 = 0;
        do {
          if ((uVar12 != uVar13) && (*(int *)(local_218._0_8_ + uVar13 * 4) != -1)) {
            lVar10 = *(long *)&(((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->pattern_graph_rows).
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
            ;
            lVar4 = (ulong)(this->max_graphs * (int)uVar12 + g) * 0x88;
            if (*(uint *)(lVar10 + 0x80 + lVar4) < 0x11) {
              lVar10 = lVar10 + lVar4;
            }
            else {
              lVar10 = *(long *)(lVar10 + lVar4);
            }
            iVar9 = (int)uVar13;
            iVar11 = iVar9 + 0x3f;
            if (-1 < iVar9) {
              iVar11 = iVar9;
            }
            if ((*(ulong *)(lVar10 + (long)(iVar11 >> 6) * 8) >> (uVar13 & 0x3f) & 1) != 0) {
              InputGraph::add_edge
                        ((InputGraph *)&local_1e8,*(int *)(local_218._0_8_ + uVar12 * 4),
                         *(int *)(local_218._0_8_ + uVar13 * 4));
              uVar8 = this->pattern_size;
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar8);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar8);
  }
  local_148[0x1c] = 0;
  local_148[0x24] = false;
  local_120._M_head_impl = (RestartsSchedule *)0x0;
  local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148._16_8_ = 0;
  local_118._0_4_ = 0xffffffff;
  local_118._4_4_ = SingletonsFirst;
  local_110 = false;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  p_Stack_f8 = (_Manager_type)0x0;
  p_Stack_f0 = (_Invoker_type)0x0;
  local_e8._M_engaged = false;
  local_80 = false;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = false;
  puVar2 = (undefined8 *)
           ((this->_imp)._M_t.
            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
            ._M_t.
            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           params;
  local_148._0_8_ = *puVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1));
  local_148._16_8_ = std::chrono::_V2::steady_clock::now();
  _Var6._M_head_impl = (RestartsSchedule *)operator_new(8);
  local_78 = &PTR__RestartsSchedule_001a0670;
  *_Var6._M_head_impl = (RestartsSchedule)&PTR__RestartsSchedule_001a0670;
  if ((_Head_base<0UL,_gss::RestartsSchedule_*,_false>)local_120._M_head_impl !=
      (_Head_base<0UL,_gss::RestartsSchedule_*,_false>)0x0) {
    ppp_Var5 = &(local_120._M_head_impl)->_vptr_RestartsSchedule;
    local_120._M_head_impl = _Var6._M_head_impl;
    (*(*ppp_Var5)[1])();
    _Var6._M_head_impl = local_120._M_head_impl;
  }
  local_120._M_head_impl = _Var6._M_head_impl;
  solve_clique_problem((CliqueResult *)local_1d0,(InputGraph *)&local_1e8,(CliqueParams *)local_148)
  ;
  if ((_Rb_tree_node_base *)local_1c8._16_8_ != (_Rb_tree_node_base *)local_1c8) {
    p_Var7 = (_Rb_tree_node_base *)local_1c8._16_8_;
    do {
      pattern_vertex_for_proof_abi_cxx11_
                (&local_260,this,
                 local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)p_Var7[1]._M_color]);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)&local_168,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.second._M_dataplus._M_p != &local_260.second.field_2) {
        operator_delete(local_260.second._M_dataplus._M_p,
                        local_260.second.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Rb_tree_node_base *)local_1c8);
  }
  local_1f0 = local_1a8;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_188);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1d0);
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  if (local_e8._M_engaged == true) {
    std::_Optional_payload_base<gss::ProofOptions>::_M_destroy(&local_e8);
  }
  if (p_Stack_f8 != (_Manager_type)0x0) {
    (*p_Stack_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_120._M_head_impl != (RestartsSchedule *)0x0) {
    (*(local_120._M_head_impl)->_vptr_RestartsSchedule[1])();
  }
  local_120._M_head_impl = (RestartsSchedule *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  InputGraph::~InputGraph((InputGraph *)&local_1e8);
  if (local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,local_218.second._M_string_length - local_218._0_8_);
  }
  local_148._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_230,(ulong)this->target_size,(value_type_conflict1 *)local_148,
             (allocator_type *)local_1d0);
  local_148._0_8_ = (ulong)(uint)local_148._4_4_ << 0x20;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1e8,(ulong)this->target_size,(value_type_conflict1 *)local_148,
             (allocator_type *)local_1d0);
  local_274 = 0;
  uVar8 = this->target_size;
  if (0 < (int)uVar8) {
    iVar9 = (int)local_270;
    uVar12 = local_270 & 0xffffffff;
    iVar11 = iVar9 + 0x3f;
    if (-1 < iVar9) {
      iVar11 = iVar9;
    }
    uVar13 = 0;
    local_68 = (long)(iVar11 >> 6);
    local_70 = 1L << (local_270 & 0x3f);
    do {
      if (uVar12 != uVar13) {
        iVar9 = (int)uVar13;
        lVar10 = *(long *)&(((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl)->target_graph_rows).
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
        ;
        lVar4 = (ulong)(this->max_graphs * iVar9 + g) * 0x88;
        if (*(uint *)(lVar10 + 0x80 + lVar4) < 0x11) {
          lVar10 = lVar10 + lVar4;
        }
        else {
          lVar10 = *(long *)(lVar10 + lVar4);
        }
        if ((*(ulong *)(lVar10 + local_68 * 8) & local_70) != 0) {
          target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_148,this,iVar9);
          std::
          _Rb_tree<int,std::pair<int_const,std::pair<int,std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::pair<int,std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<int,std::__cxx11::string>>>>
          ::_M_emplace_unique<int&,std::pair<int,std::__cxx11::string>>
                    ((_Rb_tree<int,std::pair<int_const,std::pair<int,std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::pair<int,std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<int,std::__cxx11::string>>>>
                      *)&local_60,&local_274,(NamedVertex *)local_148);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x18)) {
            operator_delete((void *)local_148._8_8_,local_148._24_8_ + 1);
          }
          local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13] = local_274;
          local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_274] = iVar9;
          local_274 = local_274 + 1;
          uVar8 = this->target_size;
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)(int)uVar8);
  }
  pPVar3 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_148,this,(int)local_268);
  target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_1d0,this,(int)local_270);
  Proof::prepare_hom_clique_proof
            (pPVar3,(NamedVertex *)local_148,(NamedVertex *)local_1d0,(uint)local_1f0);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x18)) {
    operator_delete((void *)local_148._8_8_,local_148._24_8_ + 1);
  }
  InputGraph::InputGraph(&local_238,local_274,false,false);
  uVar8 = this->target_size;
  if (uVar8 != 0) {
    uVar12 = 0;
    do {
      if (local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12] == -1 || uVar8 == 0) {
        uVar13 = (ulong)uVar8;
      }
      else {
        uVar14 = 0;
        do {
          if ((uVar12 != uVar14) &&
             (local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] != -1)) {
            _Var1._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
            lVar10 = *(long *)&((_Var1._M_head_impl)->target_graph_rows).
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
            ;
            lVar4 = (ulong)(this->max_graphs * (int)uVar12 + g) * 0x88;
            if (*(uint *)(lVar10 + 0x80 + lVar4) < 0x11) {
              lVar10 = lVar10 + lVar4;
            }
            else {
              lVar10 = *(long *)(lVar10 + lVar4);
            }
            iVar9 = (int)uVar14;
            iVar11 = iVar9 + 0x3f;
            if (-1 < iVar9) {
              iVar11 = iVar9;
            }
            if ((*(ulong *)(lVar10 + (long)(iVar11 >> 6) * 8) >> (uVar14 & 0x3f) & 1) == 0) {
              if (uVar12 < uVar14) {
                pPVar3 = ((_Var1._M_head_impl)->proof).
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_148,this,(int)local_268);
                target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_1d0,this,(int)local_270);
                target_vertex_for_proof_abi_cxx11_(&local_260,this,(int)uVar12);
                target_vertex_for_proof_abi_cxx11_(&local_218,this,iVar9);
                Proof::add_hom_clique_non_edge
                          (pPVar3,(NamedVertex *)local_148,(NamedVertex *)local_1d0,&local_168,
                           &local_260,&local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218.second._M_dataplus._M_p != &local_218.second.field_2) {
                  operator_delete(local_218.second._M_dataplus._M_p,
                                  local_218.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260.second._M_dataplus._M_p != &local_260.second.field_2) {
                  operator_delete(local_260.second._M_dataplus._M_p,
                                  local_260.second.field_2._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
                  operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x18)) {
                  operator_delete((void *)local_148._8_8_,local_148._24_8_ + 1);
                }
              }
            }
            else {
              InputGraph::add_edge
                        (&local_238,
                         local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12],
                         local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14]);
            }
          }
          uVar8 = this->target_size;
          uVar13 = (ulong)uVar8;
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar13);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar13);
  }
  pPVar3 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_148,this,(int)local_268);
  target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_1d0,this,(int)local_270);
  Proof::start_hom_clique_proof
            (pPVar3,(NamedVertex *)local_148,&local_168,(NamedVertex *)local_1d0,
             (map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_60);
  uVar12 = local_1f0 & 0xffffffff;
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x18)) {
    operator_delete((void *)local_148._8_8_,local_148._24_8_ + 1);
  }
  local_148[0x1c] = 0;
  local_148[0x24] = false;
  local_120._M_head_impl = (RestartsSchedule *)0x0;
  local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148._16_8_ = 0;
  local_118._0_4_ = 0xffffffff;
  local_118._4_4_ = SingletonsFirst;
  local_110 = false;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  p_Stack_f8 = (_Manager_type)0x0;
  p_Stack_f0 = (_Invoker_type)0x0;
  local_e8._M_engaged = false;
  local_80 = false;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = false;
  puVar2 = (undefined8 *)
           ((this->_imp)._M_t.
            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
            ._M_t.
            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           params;
  local_148._0_8_ = *puVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1));
  local_148._16_8_ = std::chrono::_V2::steady_clock::now();
  local_148._24_8_ = uVar12 | 0x100000000;
  _Var6._M_head_impl = (RestartsSchedule *)operator_new(8);
  *_Var6._M_head_impl = (RestartsSchedule)local_78;
  if ((_Head_base<0UL,_gss::RestartsSchedule_*,_false>)local_120._M_head_impl !=
      (_Head_base<0UL,_gss::RestartsSchedule_*,_false>)0x0) {
    ppp_Var5 = &(local_120._M_head_impl)->_vptr_RestartsSchedule;
    local_120._M_head_impl = _Var6._M_head_impl;
    (*(*ppp_Var5)[1])();
    _Var6._M_head_impl = local_120._M_head_impl;
  }
  local_120._M_head_impl = _Var6._M_head_impl;
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  local_98 = ((_Var1._M_head_impl)->proof).
             super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&_Stack_90,
             &((_Var1._M_head_impl)->proof).
              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_88 = true;
  solve_clique_problem((CliqueResult *)local_1d0,&local_238,(CliqueParams *)local_148);
  if ((local_170 == true) && (local_1a8 != 0)) {
    this_00 = (ProofError *)__cxa_allocate_exception(0x28);
    local_260._0_8_ = (long)&local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"Oops, found a clique that shound\'t exist","");
    ProofError::ProofError(this_00,(string *)&local_260);
    __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
  }
  pPVar3 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_(&local_260,this,(int)local_268);
  target_vertex_for_proof_abi_cxx11_(&local_218,this,(int)local_270);
  Proof::finish_hom_clique_proof(pPVar3,&local_260,&local_218,(uint)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.second._M_dataplus._M_p != &local_218.second.field_2) {
    operator_delete(local_218.second._M_dataplus._M_p,
                    local_218.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.second._M_dataplus._M_p != &local_260.second.field_2) {
    operator_delete(local_260.second._M_dataplus._M_p,
                    local_260.second.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_188);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1d0);
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  if (local_e8._M_engaged == true) {
    std::_Optional_payload_base<gss::ProofOptions>::_M_destroy(&local_e8);
  }
  if (p_Stack_f8 != (_Manager_type)0x0) {
    (*p_Stack_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_120._M_head_impl != (RestartsSchedule *)0x0) {
    (*(local_120._M_head_impl)->_vptr_RestartsSchedule[1])();
  }
  local_120._M_head_impl = (RestartsSchedule *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  InputGraph::~InputGraph(&local_238);
  if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_168);
  return;
}

Assistant:

auto HomomorphismModel::_prove_no_clique(
    unsigned g,
    int p,
    int tt) const -> void
{
    vector<NamedVertex> p_clique;
    map<int, NamedVertex> t_clique_neighbourhood;
    unsigned decide_size;

    {
        vector<int> include(pattern_size, -1), invinclude(pattern_size, 0);
        int count = 0;
        for (int w = 0; w < int(pattern_size); ++w)
            if (w != p && _imp->pattern_graph_rows[w * max_graphs + g].test(p)) {
                include[w] = count;
                invinclude[count] = w;
                ++count;
            }

        InputGraph gv(count, false, false);
        for (unsigned f = 0; f < pattern_size; ++f)
            if (include[f] != -1)
                for (unsigned t = 0; t < pattern_size; ++t)
                    if (f != t && include[t] != -1 && _imp->pattern_graph_rows[f * max_graphs + g].test(t))
                        gv.add_edge(include[f], include[t]);

        CliqueParams params;
        params.timeout = _imp->params.timeout;
        params.start_time = steady_clock::now();
        params.restarts_schedule = make_unique<NoRestartsSchedule>();
        auto result = solve_clique_problem(gv, params);
        for (auto & v : result.clique)
            p_clique.push_back(pattern_vertex_for_proof(invinclude[v]));
        decide_size = result.clique.size();
    }

    {
        vector<int> include(target_size, -1), invinclude(target_size, 0);
        int count = 0;
        for (int w = 0; w < int(target_size); ++w)
            if (w != tt && _imp->target_graph_rows[w * max_graphs + g].test(tt)) {
                t_clique_neighbourhood.emplace(count, target_vertex_for_proof(w));
                include[w] = count;
                invinclude[count] = w;
                ++count;
            }

        _imp->proof->prepare_hom_clique_proof(pattern_vertex_for_proof(p), target_vertex_for_proof(tt), decide_size);

        InputGraph gv(count, false, false);
        for (unsigned f = 0; f < target_size; ++f)
            if (include[f] != -1)
                for (unsigned t = 0; t < target_size; ++t) {
                    if (f != t && include[t] != -1) {
                        if (_imp->target_graph_rows[f * max_graphs + g].test(t))
                            gv.add_edge(include[f], include[t]);
                        else if (f < t)
                            _imp->proof->add_hom_clique_non_edge(
                                pattern_vertex_for_proof(p), target_vertex_for_proof(tt),
                                p_clique, target_vertex_for_proof(f), target_vertex_for_proof(t));
                    }
                }

        _imp->proof->start_hom_clique_proof(pattern_vertex_for_proof(p), move(p_clique), target_vertex_for_proof(tt), move(t_clique_neighbourhood));

        CliqueParams params;
        params.timeout = _imp->params.timeout;
        params.start_time = steady_clock::now();
        params.decide = make_optional(decide_size);
        params.restarts_schedule = make_unique<NoRestartsSchedule>();
        params.extend_proof = _imp->proof;
        params.proof_is_for_hom = true;

        auto result = solve_clique_problem(gv, params);
        if (result.complete && ! result.clique.empty())
            throw ProofError{"Oops, found a clique that shound't exist"};
        _imp->proof->finish_hom_clique_proof(pattern_vertex_for_proof(p), target_vertex_for_proof(tt), decide_size);
    }
}